

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Fixed ft_trig_downscale(PVG_FT_Fixed val)

{
  long local_30;
  long local_28;
  PVG_FT_Int64 v;
  PVG_FT_Fixed s;
  PVG_FT_Fixed val_local;
  
  local_28 = val;
  if (val < 0) {
    local_28 = -val;
  }
  local_30 = local_28 * 0xdbd95b16 + 0x100000000 >> 0x20;
  if (val < 0) {
    local_30 = -local_30;
  }
  return local_30;
}

Assistant:

static PVG_FT_Fixed ft_trig_downscale(PVG_FT_Fixed val)
{
    PVG_FT_Fixed s;
    PVG_FT_Int64 v;

    s = val;
    val = PVG_FT_ABS(val);

    v = (val * (PVG_FT_Int64)PVG_FT_TRIG_SCALE) + 0x100000000UL;
    val = (PVG_FT_Fixed)(v >> 32);

    return (s >= 0) ? val : -val;
}